

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O3

bool __thiscall
httplib::Server::write_response_core
          (Server *this,Stream *strm,bool close_connection,Request *req,Response *res,
          bool need_apply_ranges)

{
  Headers *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Response *pRVar2;
  Request *req_00;
  Stream *strm_00;
  bool bVar3;
  HandlerResponse HVar4;
  int iVar5;
  ostream *poVar6;
  _Alloc_hider _Var7;
  const_iterator cVar8;
  long lVar9;
  ssize_t sVar10;
  _Base_ptr p_Var11;
  long lVar12;
  undefined4 extraout_var;
  char cVar13;
  char *__s;
  bool bVar14;
  pair<std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  pVar15;
  string boundary;
  string content_type;
  stringstream ss;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  _Base_ptr local_230;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_220;
  char *local_218;
  Response *local_210;
  Request *local_208;
  Stream *local_200;
  string local_1f8;
  string local_1d8;
  undefined1 local_1b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  undefined8 local_190;
  ios_base local_138 [264];
  
  local_200 = strm;
  if (res->status == -1) {
    __assert_fail("res.status != -1",
                  "/workspace/llm4binary/github/license_c_cmakelists/jsonrpcx[P]json-rpc-cxx/vendor/cpp-httplib/httplib.h"
                  ,0x13b2,
                  "bool httplib::Server::write_response_core(Stream &, bool, const Request &, Response &, bool)"
                 );
  }
  if ((res->status < 400) ||
     ((this->error_handler_).super__Function_base._M_manager == (_Manager_type)0x0)) {
    local_220 = &local_1d8.field_2;
    local_1d8._M_string_length = 0;
    local_1d8.field_2._M_local_buf[0] = '\0';
    local_228 = &local_1f8.field_2;
    local_1f8._M_string_length = 0;
    local_1f8.field_2._M_local_buf[0] = '\0';
    local_1f8._M_dataplus._M_p = (pointer)local_228;
    local_1d8._M_dataplus._M_p = (pointer)local_220;
    if (need_apply_ranges) goto LAB_0013f15b;
  }
  else {
    HVar4 = (*(this->error_handler_)._M_invoker)((_Any_data *)&this->error_handler_,req,res);
    local_220 = &local_1d8.field_2;
    local_1d8._M_string_length = 0;
    local_1d8.field_2._M_local_buf[0] = '\0';
    local_228 = &local_1f8.field_2;
    local_1f8._M_string_length = 0;
    local_1f8.field_2._M_local_buf[0] = '\0';
    local_1f8._M_dataplus._M_p = (pointer)local_228;
    local_1d8._M_dataplus._M_p = (pointer)local_220;
    if (HVar4 == Handled || need_apply_ranges) {
LAB_0013f15b:
      local_220 = &local_1d8.field_2;
      local_228 = &local_1f8.field_2;
      local_1d8.field_2._M_local_buf[0] = '\0';
      local_1d8._M_string_length = 0;
      local_1f8.field_2._M_local_buf[0] = '\0';
      local_1f8._M_string_length = 0;
      local_1f8._M_dataplus._M_p = (pointer)local_228;
      local_1d8._M_dataplus._M_p = (pointer)local_220;
      apply_ranges(this,req,res,&local_1d8,&local_1f8);
    }
  }
  if (close_connection) {
LAB_0013f32d:
    local_1b8._0_8_ = "Connection";
    local_250._M_dataplus._M_p = "close";
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::_M_emplace_equal<char_const*&,char_const*&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)&res->headers,(char **)local_1b8,(char **)&local_250);
  }
  else {
    local_1b8._0_8_ = &((key_type *)local_1b8)->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"Connection","");
    pVar15 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::equal_range(&(req->headers)._M_t,(key_type *)local_1b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._0_8_ != &((key_type *)local_1b8)->field_2) {
      operator_delete((void *)local_1b8._0_8_,local_1a8._M_allocated_capacity + 1);
    }
    if (pVar15.first._M_node._M_node == pVar15.second._M_node._M_node) {
      __s = "";
    }
    else {
      __s = *(char **)(pVar15.first._M_node._M_node + 2);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_250,__s,(allocator<char> *)local_1b8);
    iVar5 = std::__cxx11::string::compare((char *)&local_250);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
    }
    if (iVar5 == 0) goto LAB_0013f32d;
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&((key_type *)local_1b8)->field_2,"timeout=",8);
    poVar6 = std::ostream::_M_insert<long>((long)&((key_type *)local_1b8)->field_2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", max=",6);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    std::__cxx11::stringbuf::str();
    local_218 = "Keep-Alive";
    cVar13 = *local_250._M_dataplus._M_p;
    _Var7._M_p = local_250._M_dataplus._M_p;
    while (cVar13 != '\0') {
      _Var7._M_p = _Var7._M_p + 1;
      if ((cVar13 == '\n') || (cVar13 == '\r')) goto LAB_0013f2f3;
      cVar13 = *_Var7._M_p;
    }
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::_M_emplace_equal<char_const*&,std::__cxx11::string_const&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)&res->headers,&local_218,&local_250);
LAB_0013f2f3:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  paVar1 = &((key_type *)local_1b8)->field_2;
  local_1b8._0_8_ = paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"Content-Type","");
  this_00 = &res->headers;
  cVar8 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&this_00->_M_t,(key_type *)local_1b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._0_8_ != paVar1) {
    operator_delete((void *)local_1b8._0_8_,local_1a8._M_allocated_capacity + 1);
  }
  local_230 = &(res->headers)._M_t._M_impl.super__Rb_tree_header._M_header;
  if ((cVar8._M_node == local_230) &&
     ((((res->body)._M_string_length != 0 || (res->content_length_ != 0)) ||
      ((res->content_provider_).super__Function_base._M_manager != (_Manager_type)0x0)))) {
    local_1b8._0_8_ = "Content-Type";
    local_250._M_dataplus._M_p = "text/plain";
    cVar13 = 'C';
    lVar9 = 1;
    do {
      if ((cVar13 == '\n') || (cVar13 == '\r')) goto LAB_0013f42a;
      cVar13 = "Content-Type"[lVar9];
      lVar9 = lVar9 + 1;
    } while (lVar9 != 0xd);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::_M_emplace_equal<char_const*&,char_const*&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)this_00,(char **)local_1b8,(char **)&local_250);
  }
LAB_0013f42a:
  local_1b8._0_8_ = paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"Content-Length","");
  cVar8 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&this_00->_M_t,(key_type *)local_1b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._0_8_ != paVar1) {
    operator_delete((void *)local_1b8._0_8_,local_1a8._M_allocated_capacity + 1);
  }
  if (((cVar8._M_node == local_230) && ((res->body)._M_string_length == 0)) &&
     ((res->content_length_ == 0 &&
      ((res->content_provider_).super__Function_base._M_manager == (_Manager_type)0x0)))) {
    local_1b8._0_8_ = "Content-Length";
    local_250._M_dataplus._M_p = "0";
    cVar13 = 'C';
    lVar9 = 1;
    do {
      if ((cVar13 == '\n') || (cVar13 == '\r')) goto LAB_0013f486;
      cVar13 = "Content-Length"[lVar9];
      lVar9 = lVar9 + 1;
    } while (lVar9 != 0xf);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::_M_emplace_equal<char_const*&,char_const*&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)this_00,(char **)local_1b8,(char **)&local_250);
  }
LAB_0013f486:
  local_1b8._0_8_ = paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"Accept-Ranges","");
  cVar8 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&this_00->_M_t,(key_type *)local_1b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._0_8_ != paVar1) {
    operator_delete((void *)local_1b8._0_8_,local_1a8._M_allocated_capacity + 1);
  }
  if ((cVar8._M_node == local_230) &&
     (iVar5 = std::__cxx11::string::compare((char *)req), iVar5 == 0)) {
    local_1b8._0_8_ = "Accept-Ranges";
    local_250._M_dataplus._M_p = "bytes";
    cVar13 = 'A';
    lVar9 = 1;
    do {
      if ((cVar13 == '\n') || (cVar13 == '\r')) goto LAB_0013f4f5;
      cVar13 = "Accept-Ranges"[lVar9];
      lVar9 = lVar9 + 1;
    } while (lVar9 != 0xe);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::_M_emplace_equal<char_const*&,char_const*&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)this_00,(char **)local_1b8,(char **)&local_250);
  }
LAB_0013f4f5:
  if ((this->post_routing_handler_).super__Function_base._M_manager != (_Manager_type)0x0) {
    (*(this->post_routing_handler_)._M_invoker)((_Any_data *)&this->post_routing_handler_,req,res);
  }
  local_1b8._8_8_ = (long)(((key_type *)local_1b8)->field_2)._M_local_buf + 8;
  local_1b8._0_8_ = &PTR__BufferStream_0016e228;
  local_1a8._M_allocated_capacity = 0;
  local_1a8._M_local_buf[8] = '\0';
  local_190 = 0;
  local_210 = res;
  local_208 = req;
  local_250._M_dataplus._M_p = detail::status_message(res->status);
  sVar10 = Stream::write_format<int,char_const*>
                     ((Stream *)local_1b8,"HTTP/1.1 %d %s\r\n",&res->status,(char **)&local_250);
  if (sVar10 != 0) {
    p_Var11 = (local_210->headers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    if (p_Var11 == local_230) {
      lVar9 = 0;
    }
    else {
      lVar9 = 0;
      do {
        local_250._M_dataplus._M_p = *(pointer *)(p_Var11 + 1);
        local_218 = *(char **)(p_Var11 + 2);
        sVar10 = Stream::write_format<char_const*,char_const*>
                           ((Stream *)local_1b8,"%s: %s\r\n",(char **)&local_250,&local_218);
        if (sVar10 < 0) goto LAB_0013f69f;
        lVar9 = lVar9 + sVar10;
        p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11);
      } while (p_Var11 != local_230);
    }
    lVar12 = (**(code **)(local_1b8._0_8_ + 0x28))((key_type *)local_1b8,"\r\n",2);
    if (lVar12 < 0) {
      lVar9 = 0;
    }
    if (lVar9 != 0 || lVar12 != 0) {
LAB_0013f69f:
      strm_00 = local_200;
      (*local_200->_vptr_Stream[5])(local_200,local_1b8._8_8_,local_1a8._M_allocated_capacity);
      req_00 = local_208;
      local_1b8._0_8_ = &PTR__BufferStream_0016e228;
      if ((undefined1 *)local_1b8._8_8_ !=
          (undefined1 *)((long)(((key_type *)local_1b8)->field_2)._M_local_buf + 8U)) {
        operator_delete((void *)local_1b8._8_8_,
                        CONCAT71(local_1a8._9_7_,local_1a8._M_local_buf[8]) + 1);
      }
      iVar5 = std::__cxx11::string::compare((char *)req_00);
      pRVar2 = local_210;
      bVar14 = true;
      if (iVar5 != 0) {
        if ((local_210->body)._M_string_length == 0) {
          if ((local_210->content_provider_).super__Function_base._M_manager != (_Manager_type)0x0)
          {
            bVar3 = write_content_with_provider(this,strm_00,req_00,local_210,&local_1f8,&local_1d8)
            ;
            if (bVar3) {
              pRVar2->content_provider_success_ = true;
            }
            else {
              pRVar2->content_provider_success_ = false;
              bVar14 = false;
            }
          }
        }
        else {
          iVar5 = (*strm_00->_vptr_Stream[5])(strm_00,(local_210->body)._M_dataplus._M_p);
          bVar14 = CONCAT44(extraout_var,iVar5) != 0;
        }
      }
      if ((this->logger_).super__Function_base._M_manager != (_Manager_type)0x0) {
        (*(this->logger_)._M_invoker)((_Any_data *)&this->logger_,req_00,pRVar2);
      }
      goto LAB_0013f791;
    }
  }
  local_1b8._0_8_ = &PTR__BufferStream_0016e228;
  if ((undefined1 *)local_1b8._8_8_ !=
      (undefined1 *)((long)(((key_type *)local_1b8)->field_2)._M_local_buf + 8U)) {
    operator_delete((void *)local_1b8._8_8_,CONCAT71(local_1a8._9_7_,local_1a8._M_local_buf[8]) + 1)
    ;
  }
  bVar14 = false;
LAB_0013f791:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != local_228) {
    operator_delete(local_1f8._M_dataplus._M_p,
                    CONCAT71(local_1f8.field_2._M_allocated_capacity._1_7_,
                             local_1f8.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != local_220) {
    operator_delete(local_1d8._M_dataplus._M_p,
                    CONCAT71(local_1d8.field_2._M_allocated_capacity._1_7_,
                             local_1d8.field_2._M_local_buf[0]) + 1);
  }
  return bVar14;
}

Assistant:

inline bool Server::write_response_core(Stream &strm, bool close_connection,
                                        const Request &req, Response &res,
                                        bool need_apply_ranges) {
  assert(res.status != -1);

  if (400 <= res.status && error_handler_ &&
      error_handler_(req, res) == HandlerResponse::Handled) {
    need_apply_ranges = true;
  }

  std::string content_type;
  std::string boundary;
  if (need_apply_ranges) { apply_ranges(req, res, content_type, boundary); }

  // Prepare additional headers
  if (close_connection || req.get_header_value("Connection") == "close") {
    res.set_header("Connection", "close");
  } else {
    std::stringstream ss;
    ss << "timeout=" << keep_alive_timeout_sec_
       << ", max=" << keep_alive_max_count_;
    res.set_header("Keep-Alive", ss.str());
  }

  if (!res.has_header("Content-Type") &&
      (!res.body.empty() || res.content_length_ > 0 || res.content_provider_)) {
    res.set_header("Content-Type", "text/plain");
  }

  if (!res.has_header("Content-Length") && res.body.empty() &&
      !res.content_length_ && !res.content_provider_) {
    res.set_header("Content-Length", "0");
  }

  if (!res.has_header("Accept-Ranges") && req.method == "HEAD") {
    res.set_header("Accept-Ranges", "bytes");
  }

  if (post_routing_handler_) { post_routing_handler_(req, res); }

  // Response line and headers
  {
    detail::BufferStream bstrm;

    if (!bstrm.write_format("HTTP/1.1 %d %s\r\n", res.status,
                            detail::status_message(res.status))) {
      return false;
    }

    if (!detail::write_headers(bstrm, res.headers)) { return false; }

    // Flush buffer
    auto &data = bstrm.get_buffer();
    strm.write(data.data(), data.size());
  }

  // Body
  auto ret = true;
  if (req.method != "HEAD") {
    if (!res.body.empty()) {
      if (!strm.write(res.body)) { ret = false; }
    } else if (res.content_provider_) {
      if (write_content_with_provider(strm, req, res, boundary, content_type)) {
        res.content_provider_success_ = true;
      } else {
        res.content_provider_success_ = false;
        ret = false;
      }
    }
  }

  // Log
  if (logger_) { logger_(req, res); }

  return ret;
}